

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::RadioButton(char *label,bool active)

{
  bool bVar1;
  byte in_SIL;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImVec2 label_pos;
  float pad;
  bool pressed;
  bool held;
  bool hovered;
  float radius;
  ImVec2 center;
  ImRect total_bb;
  ImRect check_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImRect *in_stack_fffffffffffffec8;
  ImRect *in_stack_fffffffffffffed0;
  ImVec2 *in_stack_fffffffffffffed8;
  ImDrawList *pIVar5;
  float in_stack_fffffffffffffee0;
  ImGuiCol in_stack_fffffffffffffee4;
  float fVar6;
  ImRect *in_stack_fffffffffffffee8;
  ImDrawList *center_00;
  undefined4 in_stack_fffffffffffffef0;
  ImGuiID in_stack_fffffffffffffef4;
  float fVar7;
  ImRect *in_stack_fffffffffffffef8;
  undefined1 hide_text_after_hash;
  undefined4 in_stack_ffffffffffffff10;
  ImVec2 *pIVar8;
  float in_stack_ffffffffffffff20;
  ImGuiButtonFlags flags;
  undefined4 in_stack_ffffffffffffff38;
  bool *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  byte bVar9;
  undefined4 in_stack_ffffffffffffff68;
  ImGuiNavHighlightFlags flags_00;
  ImRect *bb;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect local_78;
  ImVec2 local_68;
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  float local_40;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (char *)in_stack_fffffffffffffee8,
                                  (char *)CONCAT44(in_stack_fffffffffffffee4,
                                                   in_stack_fffffffffffffee0));
    local_3c = CalcTextSize((char *)in_stack_fffffffffffffef8,
                            (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffee8,0));
    local_40 = GetFrameHeight();
    local_48 = (local_20->DC).CursorPos;
    pIVar8 = &local_68;
    ImVec2::ImVec2(pIVar8,local_40,local_40);
    flags = (ImGuiButtonFlags)((ulong)pIVar8 >> 0x20);
    local_60 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x4f3cc0);
    ImRect::ImRect(&local_58,&local_48,&local_60);
    if (local_3c.x <= 0.0) {
      fVar2 = 0.0;
    }
    else {
      fVar2 = (local_30->ItemInnerSpacing).x + local_3c.x;
    }
    fVar3 = (local_30->FramePadding).y;
    pIVar8 = &local_88;
    fVar6 = local_40;
    ImVec2::ImVec2(pIVar8,local_40 + fVar2,fVar3 + fVar3 + local_3c.y);
    local_80 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x4f3d81);
    ImRect::ImRect(&local_78,&local_48,&local_80);
    ItemSize(in_stack_fffffffffffffed0,(float)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    bVar1 = ItemAdd(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,
                    in_stack_fffffffffffffee4);
    if (bVar1) {
      IVar4 = ImRect::GetCenter(in_stack_fffffffffffffec8);
      bb = (ImRect *)CONCAT44((float)(int)(IVar4.y + 0.5),(float)(int)(IVar4.x + 0.5));
      fVar3 = (local_40 - 1.0) * 0.5;
      bVar1 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                             ,(ImGuiID)in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
                             (bool *)CONCAT44(fVar6,in_stack_ffffffffffffff38),flags);
      flags_00 = CONCAT22((short)((uint)in_stack_ffffffffffffff68 >> 0x10),
                          CONCAT11(bVar1,(char)in_stack_ffffffffffffff68));
      if (bVar1) {
        MarkItemEdited(local_34);
      }
      RenderNavHighlight(bb,(ImGuiID)fVar3,flags_00);
      bVar9 = (byte)((uint)flags_00 >> 8);
      hide_text_after_hash = (undefined1)((ulong)local_20->DrawList >> 0x38);
      fVar6 = fVar3;
      GetColorU32(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
      ImDrawList::AddCircleFilled
                ((ImDrawList *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8,(float)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (ImU32)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if ((local_11 & 1) != 0) {
        in_stack_ffffffffffffff64 = ImMax<float>(1.0,(float)(int)(local_40 / 6.0));
        GetColorU32(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
        ImDrawList::AddCircleFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8,(float)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (ImU32)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20))
        ;
      }
      if (0.0 < local_30->FrameBorderSize) {
        pIVar5 = local_20->DrawList;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,1.0,1.0);
        IVar4 = ::operator+(&in_stack_fffffffffffffec8->Min,(ImVec2 *)0x4f4056);
        in_stack_ffffffffffffff5c = IVar4.x;
        in_stack_ffffffffffffff60 = IVar4.y;
        fVar7 = fVar6;
        GetColorU32((ImGuiCol)fVar6,in_stack_fffffffffffffee0);
        ImDrawList::AddCircle
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   &in_stack_fffffffffffffee8->Min,fVar6,(ImU32)in_stack_fffffffffffffee0,
                   (int)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
        center_00 = local_20->DrawList;
        GetColorU32((ImGuiCol)fVar6,in_stack_fffffffffffffee0);
        ImDrawList::AddCircle
                  ((ImDrawList *)CONCAT44(fVar7,in_stack_fffffffffffffef0),(ImVec2 *)center_00,fVar6
                   ,(ImU32)in_stack_fffffffffffffee0,(int)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0));
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff4c,
                     local_58.Max.x + (local_30->ItemInnerSpacing).x,
                     local_58.Min.y + (local_30->FramePadding).y);
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      if (0.0 < local_3c.x) {
        IVar4.y = fVar2;
        IVar4.x = in_stack_ffffffffffffff20;
        RenderText(IVar4,(char *)pIVar8,(char *)CONCAT44(fVar3,in_stack_ffffffffffffff10),
                   (bool)hide_text_after_hash);
      }
      local_1 = (bool)(bVar9 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::RadioButton(const char* label, bool active)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
        return false;

    ImVec2 center = check_bb.GetCenter();
    center.x = IM_ROUND(center.x);
    center.y = IM_ROUND(center.y);
    const float radius = (square_sz - 1.0f) * 0.5f;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
        MarkItemEdited(id);

    RenderNavHighlight(total_bb, id);
    window->DrawList->AddCircleFilled(center, radius, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), 16);
    if (active)
    {
        const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        window->DrawList->AddCircleFilled(center, radius - pad, GetColorU32(ImGuiCol_CheckMark), 16);
    }

    if (style.FrameBorderSize > 0.0f)
    {
        window->DrawList->AddCircle(center + ImVec2(1, 1), radius, GetColorU32(ImGuiCol_BorderShadow), 16, style.FrameBorderSize);
        window->DrawList->AddCircle(center, radius, GetColorU32(ImGuiCol_Border), 16, style.FrameBorderSize);
    }

    ImVec2 label_pos = ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y);
    if (g.LogEnabled)
        LogRenderedText(&label_pos, active ? "(x)" : "( )");
    if (label_size.x > 0.0f)
        RenderText(label_pos, label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return pressed;
}